

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.c
# Opt level: O0

HistoryW * history_winit(void)

{
  wchar_t wVar1;
  HistoryW *h;
  HistEventW ev;
  
  ev.str = (wchar_t *)malloc(0x60);
  if ((void **)ev.str == (void **)0x0) {
    ev.str = (wchar_t *)0x0;
  }
  else {
    wVar1 = history_def_init((void **)ev.str,(HistEventW *)&h,L'\0');
    if (wVar1 == L'\xffffffff') {
      free(ev.str);
      ev.str = (wchar_t *)0x0;
    }
    else {
      *(undefined4 *)((long)ev.str + 8) = 0xffffffff;
      *(code **)((long)ev.str + 0x18) = history_def_next;
      *(code **)((long)ev.str + 0x10) = history_def_first;
      *(code **)((long)ev.str + 0x20) = history_def_last;
      *(code **)((long)ev.str + 0x28) = history_def_prev;
      *(code **)((long)ev.str + 0x30) = history_def_curr;
      *(code **)((long)ev.str + 0x38) = history_def_set;
      *(code **)((long)ev.str + 0x48) = history_def_clear;
      *(code **)((long)ev.str + 0x50) = history_def_enter;
      *(code **)((long)ev.str + 0x58) = history_def_add;
      *(code **)((long)ev.str + 0x40) = history_def_del;
    }
  }
  return (HistoryW *)ev.str;
}

Assistant:

TYPE(History) *
FUN(history,init)(void)
{
	TYPE(HistEvent) ev;
	TYPE(History) *h = (TYPE(History) *) h_malloc(sizeof(*h));
	if (h == NULL)
		return NULL;

	if (history_def_init(&h->h_ref, &ev, 0) == -1) {
		h_free(h);
		return NULL;
	}
	h->h_ent = -1;
	h->h_next = history_def_next;
	h->h_first = history_def_first;
	h->h_last = history_def_last;
	h->h_prev = history_def_prev;
	h->h_curr = history_def_curr;
	h->h_set = history_def_set;
	h->h_clear = history_def_clear;
	h->h_enter = history_def_enter;
	h->h_add = history_def_add;
	h->h_del = history_def_del;

	return h;
}